

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O0

int32_t __thiscall
webrtc::TraceImpl::AddModuleAndId(TraceImpl *this,char *trace_message,TraceModule module,int32_t id)

{
  long lVar1;
  ulong uVar2;
  unsigned_long id_channel;
  unsigned_long id_engine;
  int kMessageLength;
  long idl;
  int32_t id_local;
  TraceModule module_local;
  char *trace_message_local;
  TraceImpl *this_local;
  
  if (id == -1) {
    switch(module) {
    case kTraceUndefined:
      memset(trace_message,0x20,0x19);
      trace_message[0x19] = '\0';
      break;
    case kTraceVoice:
      sprintf(trace_message,"       VOICE:%11ld;",0xffffffffffffffff);
      break;
    case kTraceVideo:
      sprintf(trace_message,"       VIDEO:%11ld;",0xffffffffffffffff);
      break;
    case kTraceUtility:
      sprintf(trace_message,"     UTILITY:%11ld;",0xffffffffffffffff);
      break;
    case kTraceRtpRtcp:
      sprintf(trace_message,"    RTP/RTCP:%11ld;",0xffffffffffffffff);
      break;
    case kTraceTransport:
      sprintf(trace_message,"   TRANSPORT:%11ld;",0xffffffffffffffff);
      break;
    case kTraceSrtp:
      sprintf(trace_message,"        SRTP:%11ld;",0xffffffffffffffff);
      break;
    case kTraceAudioCoding:
      sprintf(trace_message,"AUDIO CODING:%11ld;",0xffffffffffffffff);
      break;
    case kTraceAudioMixerServer:
      sprintf(trace_message," AUDIO MIX/S:%11ld;",0xffffffffffffffff);
      break;
    case kTraceAudioMixerClient:
      sprintf(trace_message," AUDIO MIX/C:%11ld;",0xffffffffffffffff);
      break;
    case kTraceFile:
      sprintf(trace_message,"        FILE:%11ld;",0xffffffffffffffff);
      break;
    case kTraceAudioProcessing:
      sprintf(trace_message,"  AUDIO PROC:%11ld;",0xffffffffffffffff);
      break;
    case kTraceVideoCoding:
      sprintf(trace_message,"VIDEO CODING:%11ld;",0xffffffffffffffff);
      break;
    case kTraceVideoMixer:
      sprintf(trace_message,"   VIDEO MIX:%11ld;",0xffffffffffffffff);
      break;
    case kTraceAudioDevice:
      sprintf(trace_message,"AUDIO DEVICE:%11ld;",0xffffffffffffffff);
      break;
    case kTraceVideoRenderer:
      sprintf(trace_message,"VIDEO RENDER:%11ld;",0xffffffffffffffff);
      break;
    case kTraceVideoCapture:
      sprintf(trace_message,"VIDEO CAPTUR:%11ld;",0xffffffffffffffff);
      break;
    case kTraceRemoteBitrateEstimator:
      sprintf(trace_message,"     BWE RBE:%11ld;",0xffffffffffffffff);
    }
  }
  else {
    idl._2_2_ = (short)((uint)id >> 0x10);
    lVar1 = (long)idl._2_2_;
    idl._0_2_ = (ushort)id;
    uVar2 = (ulong)(ushort)idl;
    switch(module) {
    case kTraceUndefined:
      memset(trace_message,0x20,0x19);
      trace_message[0x19] = '\0';
      break;
    case kTraceVoice:
      sprintf(trace_message,"       VOICE:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceVideo:
      sprintf(trace_message,"       VIDEO:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceUtility:
      sprintf(trace_message,"     UTILITY:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceRtpRtcp:
      sprintf(trace_message,"    RTP/RTCP:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceTransport:
      sprintf(trace_message,"   TRANSPORT:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceSrtp:
      sprintf(trace_message,"        SRTP:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceAudioCoding:
      sprintf(trace_message,"AUDIO CODING:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceAudioMixerServer:
      sprintf(trace_message," AUDIO MIX/S:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceAudioMixerClient:
      sprintf(trace_message," AUDIO MIX/C:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceFile:
      sprintf(trace_message,"        FILE:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceAudioProcessing:
      sprintf(trace_message,"  AUDIO PROC:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceVideoCoding:
      sprintf(trace_message,"VIDEO CODING:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceVideoMixer:
      sprintf(trace_message,"   VIDEO MIX:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceAudioDevice:
      sprintf(trace_message,"AUDIO DEVICE:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceVideoRenderer:
      sprintf(trace_message,"VIDEO RENDER:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceVideoCapture:
      sprintf(trace_message,"VIDEO CAPTUR:%5ld %5ld;",lVar1,uVar2);
      break;
    case kTraceRemoteBitrateEstimator:
      sprintf(trace_message,"     BWE RBE:%5ld %5ld;",lVar1,uVar2);
    }
  }
  return 0x19;
}

Assistant:

int32_t TraceImpl::AddModuleAndId(char* trace_message,
                                  const TraceModule module,
                                  const int32_t id) const {
  // Use long int to prevent problems with different definitions of
  // int32_t.
  // TODO(hellner): is this actually a problem? If so, it should be better to
  //                clean up int32_t
  const long int idl = id;
  const int kMessageLength = 25;
  if (idl != -1) {
    const unsigned long int id_engine = id >> 16;
    const unsigned long int id_channel = id & 0xffff;

    switch (module) {
      case kTraceUndefined:
        // Add the appropriate amount of whitespace.
        memset(trace_message, ' ', kMessageLength);
        trace_message[kMessageLength] = '\0';
        break;
      case kTraceVoice:
        sprintf(trace_message, "       VOICE:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideo:
        sprintf(trace_message, "       VIDEO:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceUtility:
        sprintf(trace_message, "     UTILITY:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceRtpRtcp:
        sprintf(trace_message, "    RTP/RTCP:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceTransport:
        sprintf(trace_message, "   TRANSPORT:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioCoding:
        sprintf(trace_message, "AUDIO CODING:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceSrtp:
        sprintf(trace_message, "        SRTP:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioMixerServer:
        sprintf(trace_message, " AUDIO MIX/S:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioMixerClient:
        sprintf(trace_message, " AUDIO MIX/C:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoCoding:
        sprintf(trace_message, "VIDEO CODING:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoMixer:
        // Print sleep time and API call
        sprintf(trace_message, "   VIDEO MIX:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceFile:
        sprintf(trace_message, "        FILE:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioProcessing:
        sprintf(trace_message, "  AUDIO PROC:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioDevice:
        sprintf(trace_message, "AUDIO DEVICE:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoRenderer:
        sprintf(trace_message, "VIDEO RENDER:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoCapture:
        sprintf(trace_message, "VIDEO CAPTUR:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceRemoteBitrateEstimator:
        sprintf(trace_message, "     BWE RBE:%5ld %5ld;", id_engine,
                id_channel);
        break;
    }
  } else {
    switch (module) {
      case kTraceUndefined:
        // Add the appropriate amount of whitespace.
        memset(trace_message, ' ', kMessageLength);
        trace_message[kMessageLength] = '\0';
        break;
      case kTraceVoice:
        sprintf(trace_message, "       VOICE:%11ld;", idl);
        break;
      case kTraceVideo:
        sprintf(trace_message, "       VIDEO:%11ld;", idl);
        break;
      case kTraceUtility:
        sprintf(trace_message, "     UTILITY:%11ld;", idl);
        break;
      case kTraceRtpRtcp:
        sprintf(trace_message, "    RTP/RTCP:%11ld;", idl);
        break;
      case kTraceTransport:
        sprintf(trace_message, "   TRANSPORT:%11ld;", idl);
        break;
      case kTraceAudioCoding:
        sprintf(trace_message, "AUDIO CODING:%11ld;", idl);
        break;
      case kTraceSrtp:
        sprintf(trace_message, "        SRTP:%11ld;", idl);
        break;
      case kTraceAudioMixerServer:
        sprintf(trace_message, " AUDIO MIX/S:%11ld;", idl);
        break;
      case kTraceAudioMixerClient:
        sprintf(trace_message, " AUDIO MIX/C:%11ld;", idl);
        break;
      case kTraceVideoCoding:
        sprintf(trace_message, "VIDEO CODING:%11ld;", idl);
        break;
      case kTraceVideoMixer:
        sprintf(trace_message, "   VIDEO MIX:%11ld;", idl);
        break;
      case kTraceFile:
        sprintf(trace_message, "        FILE:%11ld;", idl);
        break;
      case kTraceAudioProcessing:
        sprintf(trace_message, "  AUDIO PROC:%11ld;", idl);
        break;
      case kTraceAudioDevice:
        sprintf(trace_message, "AUDIO DEVICE:%11ld;", idl);
        break;
      case kTraceVideoRenderer:
        sprintf(trace_message, "VIDEO RENDER:%11ld;", idl);
        break;
      case kTraceVideoCapture:
        sprintf(trace_message, "VIDEO CAPTUR:%11ld;", idl);
        break;
      case kTraceRemoteBitrateEstimator:
        sprintf(trace_message, "     BWE RBE:%11ld;", idl);
        break;
    }
  }
  return kMessageLength;
}